

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::rightTrim(String *this,String *b)

{
  int iVar1;
  int iVar2;
  
  if ((b->super_tagbstring).slen != 0) {
    iVar1 = bninchrr(&this->super_tagbstring,(this->super_tagbstring).slen + -1,&b->super_tagbstring
                    );
    iVar2 = (this->super_tagbstring).slen + -1;
    if (iVar1 != -1) {
      iVar2 = iVar1;
    }
    iVar1 = (int)((long)iVar2 + 1);
    (this->super_tagbstring).slen = iVar1;
    if (iVar1 < (this->super_tagbstring).mlen) {
      (this->super_tagbstring).data[(long)iVar2 + 1] = '\0';
    }
  }
  return;
}

Assistant:

void String::rightTrim(const String& b)
    {
                if (!b.slen) return;
        int l = invReverseFindAnyChar(b, slen - 1);
        if (l == BSTR_ERR)    l = slen - 1;
        slen = l + 1;
        if (mlen > slen) data[slen] = '\0';
    }